

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

cJSON * get_item_from_pointer(cJSON *object,char *pointer,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  cJSON_bool cVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  byte *pbVar8;
  byte *pbVar9;
  long in_FS_OFFSET;
  bool bVar10;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  if (pointer == (char *)0x0) {
LAB_0010160f:
    object = (cJSON *)0x0;
  }
  else if (object != (cJSON *)0x0) {
    bVar2 = *pointer;
    do {
      if (bVar2 != 0x2f) break;
      pointer = (char *)((byte *)pointer + 1);
      iVar4 = cJSON_IsArray(object);
      if (iVar4 == 0) {
        iVar4 = cJSON_IsObject(object);
        if (iVar4 == 0) goto LAB_0010160f;
        object = object->child;
        if (object == (cJSON *)0x0) {
          object = (cJSON *)0x0;
        }
        else {
          do {
            pbVar8 = (byte *)object->string;
            if (pbVar8 != (byte *)0x0) {
              bVar2 = *pbVar8;
              pbVar9 = (byte *)pointer;
              while (bVar2 != 0) {
                pbVar8 = pbVar8 + 1;
                bVar3 = *pbVar9;
                if (bVar3 == 0x7e) {
                  pbVar1 = pbVar9 + 1;
                  pbVar9 = pbVar9 + 1;
                  if (((bVar2 != 0x7e) || (*pbVar1 != 0x30)) &&
                     ((bVar2 != 0x2f || (*pbVar1 != 0x31)))) goto LAB_001015c3;
                }
                else {
                  if ((bVar3 == 0) || (bVar3 == 0x2f)) {
                    if ((*pbVar9 == 0) || (*pbVar9 == 0x2f)) goto LAB_001015c3;
                    goto LAB_001015f3;
                  }
                  if (case_sensitive == 0) {
                    pp_Var7 = __ctype_tolower_loc();
                    if ((*pp_Var7)[bVar2] != (*pp_Var7)[bVar3]) goto LAB_001015c3;
                  }
                  else if (bVar2 != bVar3) goto LAB_001015c3;
                }
                pbVar9 = pbVar9 + 1;
                bVar2 = *pbVar8;
              }
              if ((*pbVar9 == 0) || (*pbVar9 == 0x2f)) goto LAB_001015f3;
            }
LAB_001015c3:
            object = object->next;
          } while (object != (cJSON *)0x0);
          object = (cJSON *)0x0;
        }
      }
      else {
        local_40 = 0;
        cVar5 = decode_array_index_from_pointer((uchar *)pointer,&local_40);
        if (cVar5 == 0) goto LAB_0010160f;
        object = (cJSON *)&object->child;
        sVar6 = local_40;
        do {
          object = object->next;
          bVar10 = sVar6 != 0;
          sVar6 = sVar6 - 1;
          if (object == (cJSON *)0x0) break;
        } while (bVar10);
      }
LAB_001015f3:
      for (; (bVar2 = *pointer, bVar2 != 0 && (bVar2 != 0x2f));
          pointer = (char *)((byte *)pointer + 1)) {
      }
    } while (object != (cJSON *)0x0);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != index) {
    __stack_chk_fail();
  }
  return object;
}

Assistant:

static cJSON *get_item_from_pointer(cJSON * const object, const char * pointer, const cJSON_bool case_sensitive)
{
    cJSON *current_element = object;

    if (pointer == NULL)
    {
        return NULL;
    }

    /* follow path of the pointer */
    while ((pointer[0] == '/') && (current_element != NULL))
    {
        pointer++;
        if (cJSON_IsArray(current_element))
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer((const unsigned char*)pointer, &index))
            {
                return NULL;
            }

            current_element = get_array_item(current_element, index);
        }
        else if (cJSON_IsObject(current_element))
        {
            current_element = current_element->child;
            /* GetObjectItem. */
            while ((current_element != NULL) && !compare_pointers((unsigned char*)current_element->string, (const unsigned char*)pointer, case_sensitive))
            {
                current_element = current_element->next;
            }
        }
        else
        {
            return NULL;
        }

        /* skip to the next path token or end of string */
        while ((pointer[0] != '\0') && (pointer[0] != '/'))
        {
            pointer++;
        }
    }

    return current_element;
}